

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::memorypool::memorypool(memorypool *this)

{
  this->items = 0;
  this->maxitems = 0;
  this->alignbytes = 0;
  this->itembytes = 0;
  this->itemwords = 0;
  this->itemsperblock = 0;
  this->pathblock = (void **)0x0;
  this->pathitem = (void *)0x0;
  this->nextitem = (void *)0x0;
  this->deaditemstack = (void *)0x0;
  this->firstblock = (void **)0x0;
  this->nowblock = (void **)0x0;
  this->unallocateditems = 0;
  this->pathitemsleft = 0;
  return;
}

Assistant:

tetgenmesh::memorypool::memorypool()
{
  firstblock = nowblock = (void **) NULL;
  nextitem = (void *) NULL;
  deaditemstack = (void *) NULL;
  pathblock = (void **) NULL;
  pathitem = (void *) NULL;
  alignbytes = 0;
  itembytes = itemwords = 0;
  itemsperblock = 0;
  items = maxitems = 0l;
  unallocateditems = 0;
  pathitemsleft = 0;
}